

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::EnumNonLiteGenerator::EnumNonLiteGenerator
          (EnumNonLiteGenerator *this,EnumDescriptor *descriptor,bool immutable_api,Context *context
          )

{
  pointer *ppAVar1;
  pointer *pppEVar2;
  iterator __position;
  iterator __position_00;
  ClassNameResolver *pCVar3;
  LogMessageData *pLVar4;
  Nonnull<const_char_*> failure_msg;
  long v1;
  long lVar5;
  EnumDescriptor *pEVar6;
  EnumValueDescriptor *value;
  Alias alias;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_48;
  Alias local_40;
  
  (this->super_EnumGenerator)._vptr_EnumGenerator =
       (_func_int **)&PTR__EnumNonLiteGenerator_0084da00;
  this->descriptor_ = descriptor;
  (this->canonical_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->canonical_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->canonical_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aliases_).
  super__Vector_base<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aliases_).
  super__Vector_base<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aliases_).
  super__Vector_base<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->immutable_api_ = immutable_api;
  this->context_ = context;
  pCVar3 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar3;
  pEVar6 = this->descriptor_;
  if (0 < pEVar6->value_count_) {
    lVar5 = 0;
    v1 = 0;
    do {
      if (v1 < pEVar6->value_count_) {
        failure_msg = (Nonnull<const_char_*>)0x0;
      }
      else {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (v1,(long)pEVar6->value_count_,"index < value_count()");
      }
      if (failure_msg != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xabb,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_40);
      }
      local_48._M_head_impl = (LogMessageData *)(&pEVar6->values_->super_SymbolBaseN<0> + lVar5);
      pLVar4 = (LogMessageData *)
               EnumDescriptor::FindValueByNumber
                         (this->descriptor_,*(int *)((long)&pEVar6->values_->number_ + lVar5));
      if (local_48._M_head_impl == pLVar4) {
        __position_00._M_current =
             (this->canonical_values_).
             super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this->canonical_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::EnumValueDescriptor_const*const&>
                    ((vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
                      *)&this->canonical_values_,__position_00,(EnumValueDescriptor **)&local_48);
        }
        else {
          *__position_00._M_current = (EnumValueDescriptor *)local_48._M_head_impl;
          pppEVar2 = &(this->canonical_values_).
                      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppEVar2 = *pppEVar2 + 1;
        }
      }
      else {
        local_40.value = (EnumValueDescriptor *)local_48._M_head_impl;
        __position._M_current =
             (this->aliases_).
             super__Vector_base<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_40.canonical_value = (EnumValueDescriptor *)pLVar4;
        if (__position._M_current ==
            (this->aliases_).
            super__Vector_base<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias,std::allocator<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias>>
          ::_M_realloc_insert<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias_const&>
                    ((vector<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias,std::allocator<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias>>
                      *)&this->aliases_,__position,&local_40);
        }
        else {
          (__position._M_current)->value = (EnumValueDescriptor *)local_48._M_head_impl;
          (__position._M_current)->canonical_value = (EnumValueDescriptor *)pLVar4;
          ppAVar1 = &(this->aliases_).
                     super__Vector_base<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
      }
      v1 = v1 + 1;
      pEVar6 = this->descriptor_;
      lVar5 = lVar5 + 0x30;
    } while (v1 < pEVar6->value_count_);
  }
  return;
}

Assistant:

EnumNonLiteGenerator::EnumNonLiteGenerator(const EnumDescriptor* descriptor,
                                           bool immutable_api, Context* context)
    : descriptor_(descriptor),
      immutable_api_(immutable_api),
      context_(context),
      name_resolver_(context->GetNameResolver()) {
  for (int i = 0; i < descriptor_->value_count(); i++) {
    const EnumValueDescriptor* value = descriptor_->value(i);
    const EnumValueDescriptor* canonical_value =
        descriptor_->FindValueByNumber(value->number());

    if (value == canonical_value) {
      canonical_values_.push_back(value);
    } else {
      Alias alias;
      alias.value = value;
      alias.canonical_value = canonical_value;
      aliases_.push_back(alias);
    }
  }
}